

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *xx,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vec)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Real RVar6;
  bool bVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  cpp_dec_float<50U,_int,_void> *u;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  type_conflict5 tVar11;
  bool bVar12;
  bool bVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  cpp_dec_float<50U,_int,_void> *u_00;
  int *piVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> *local_170;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_168;
  ulong local_160;
  ulong local_158;
  uint auStack_150 [2];
  uint local_148 [2];
  uint auStack_140 [2];
  uint local_138 [2];
  long local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (this[0x38] !=
      (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
       )0x1) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)(this + 0x20),xx,vec);
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
  lVar5 = *(long *)(this + 0x20);
  bVar13 = false;
  uVar14 = (ulong)(uint)vec->memused;
  local_170 = &xx->m_backend;
  local_168 = vec;
LAB_0020f1c0:
  uVar16 = uVar14 & 0xffffffff;
  lVar15 = uVar14 * 0x3c;
  do {
    pSVar10 = local_168;
    u = local_170;
    if ((int)uVar16 < 1) {
      if (!bVar13) {
        return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)this;
      }
      piVar17 = *(int **)(this + 0x10);
      piVar1 = piVar17 + *(int *)(this + 8);
      piVar18 = piVar17;
      for (; piVar17 < piVar1; piVar17 = piVar17 + 1) {
        lVar15 = (long)*piVar17 * 0x38;
        local_a8.m_backend.exp = *(int *)(lVar5 + 0x28 + lVar15);
        local_a8.m_backend.neg = *(bool *)(lVar5 + 0x2c + lVar15);
        local_a8.m_backend._48_8_ = *(undefined8 *)(lVar5 + 0x30 + lVar15);
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar5 + lVar15);
        local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar5 + lVar15) + 2);
        puVar2 = (uint *)(lVar5 + 0x10 + lVar15);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar5 + 0x20 + lVar15);
        RVar6 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
        bVar13 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_a8,RVar6);
        if (bVar13) {
          *piVar18 = *piVar17;
          piVar18 = piVar18 + 1;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)((long)*piVar17 * 0x38 + lVar5),0);
        }
      }
      *(int *)(this + 8) = (int)((ulong)((long)piVar18 - *(long *)(this + 0x10)) >> 2);
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
    iVar3 = *(int *)((long)(&local_168->m_elem[-1].val + 1) + lVar15);
    u_00 = (cpp_dec_float<50U,_int,_void> *)((long)iVar3 * 0x38 + lVar5);
    local_1a8.data._M_elems._0_8_ = local_1a8.data._M_elems._0_8_ & 0xffffffff00000000;
    local_160 = uVar14 - 1;
    tVar11 = boost::multiprecision::operator!=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)u_00,(int *)&local_1a8);
    local_130 = lVar15 + -0x3c;
    if (tVar11) {
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_68,u,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)pSVar10->m_elem[-1].val.m_backend.data._M_elems + lVar15));
      local_1a8.fpclass = cpp_dec_float_finite;
      local_1a8.prec_elem = 10;
      local_1a8.data._M_elems[0] = 0;
      local_1a8.data._M_elems[1] = 0;
      local_1a8.data._M_elems[2] = 0;
      local_1a8.data._M_elems[3] = 0;
      local_1a8.data._M_elems[4] = 0;
      local_1a8.data._M_elems[5] = 0;
      local_1a8.data._M_elems._24_5_ = 0;
      local_1a8.data._M_elems[7]._1_3_ = 0;
      local_1a8.data._M_elems._32_5_ = 0;
      local_1a8.data._M_elems[9]._1_3_ = 0;
      local_1a8.exp = 0;
      local_1a8.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_1a8,u_00,&local_68);
      bVar7 = local_1a8.neg;
      iVar3 = local_1a8.exp;
      local_138[1]._1_3_ = local_1a8.data._M_elems[9]._1_3_;
      local_138._0_5_ = local_1a8.data._M_elems._32_5_;
      auStack_140[1]._1_3_ = local_1a8.data._M_elems[7]._1_3_;
      auStack_140._0_5_ = local_1a8.data._M_elems._24_5_;
      local_148[0] = local_1a8.data._M_elems[4];
      local_148[1] = local_1a8.data._M_elems[5];
      local_158._0_4_ = local_1a8.data._M_elems[0];
      local_158._4_4_ = local_1a8.data._M_elems[1];
      auStack_150[0] = local_1a8.data._M_elems[2];
      auStack_150[1] = local_1a8.data._M_elems[3];
      fVar8 = local_1a8.fpclass;
      iVar9 = local_1a8.prec_elem;
      local_e8.m_backend.data._M_elems[0] = local_1a8.data._M_elems[0];
      local_e8.m_backend.data._M_elems[1] = local_1a8.data._M_elems[1];
      local_e8.m_backend.data._M_elems[2] = local_1a8.data._M_elems[2];
      local_e8.m_backend.data._M_elems[3] = local_1a8.data._M_elems[3];
      local_e8.m_backend.data._M_elems[4] = local_1a8.data._M_elems[4];
      local_e8.m_backend.data._M_elems[5] = local_1a8.data._M_elems[5];
      local_e8.m_backend.exp = local_1a8.exp;
      local_e8.m_backend.neg = local_1a8.neg;
      local_e8.m_backend.fpclass = local_1a8.fpclass;
      local_e8.m_backend.prec_elem = local_1a8.prec_elem;
      local_e8.m_backend.data._M_elems._24_8_ = auStack_140;
      local_e8.m_backend.data._M_elems._32_8_ = local_138;
      RVar6 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      bVar12 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_e8,RVar6);
      if (!bVar12) break;
      *(uint (*) [2])((u_00->data)._M_elems + 8) = local_138;
      *(uint (*) [2])((u_00->data)._M_elems + 4) = local_148;
      *(uint (*) [2])((u_00->data)._M_elems + 6) = auStack_140;
      *(ulong *)(u_00->data)._M_elems = local_158;
      *(uint (*) [2])((u_00->data)._M_elems + 2) = auStack_150;
      u_00->exp = iVar3;
      u_00->neg = bVar7;
      u_00->fpclass = fVar8;
      u_00->prec_elem = iVar9;
    }
    else {
      local_1a8.fpclass = cpp_dec_float_finite;
      local_1a8.prec_elem = 10;
      local_1a8.data._M_elems[0] = 0;
      local_1a8.data._M_elems[1] = 0;
      local_1a8.data._M_elems[2] = 0;
      local_1a8.data._M_elems[3] = 0;
      local_1a8.data._M_elems[4] = 0;
      local_1a8.data._M_elems[5] = 0;
      local_1a8.data._M_elems._24_5_ = 0;
      local_1a8.data._M_elems[7]._1_3_ = 0;
      local_1a8.data._M_elems._32_5_ = 0;
      local_1a8.data._M_elems[9]._1_3_ = 0;
      local_1a8.exp = 0;
      local_1a8.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_1a8,u,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)pSVar10->m_elem[-1].val.m_backend.data._M_elems + lVar15));
      bVar7 = local_1a8.neg;
      iVar4 = local_1a8.exp;
      local_138[1]._1_3_ = local_1a8.data._M_elems[9]._1_3_;
      local_138._0_5_ = local_1a8.data._M_elems._32_5_;
      auStack_140[1]._1_3_ = local_1a8.data._M_elems[7]._1_3_;
      auStack_140._0_5_ = local_1a8.data._M_elems._24_5_;
      local_148[0] = local_1a8.data._M_elems[4];
      local_148[1] = local_1a8.data._M_elems[5];
      local_158._0_4_ = local_1a8.data._M_elems[0];
      local_158._4_4_ = local_1a8.data._M_elems[1];
      auStack_150[0] = local_1a8.data._M_elems[2];
      auStack_150[1] = local_1a8.data._M_elems[3];
      fVar8 = local_1a8.fpclass;
      iVar9 = local_1a8.prec_elem;
      local_128.m_backend.data._M_elems[0] = local_1a8.data._M_elems[0];
      local_128.m_backend.data._M_elems[1] = local_1a8.data._M_elems[1];
      local_128.m_backend.data._M_elems[2] = local_1a8.data._M_elems[2];
      local_128.m_backend.data._M_elems[3] = local_1a8.data._M_elems[3];
      local_128.m_backend.data._M_elems[4] = local_1a8.data._M_elems[4];
      local_128.m_backend.data._M_elems[5] = local_1a8.data._M_elems[5];
      local_128.m_backend.exp = local_1a8.exp;
      local_128.m_backend.neg = local_1a8.neg;
      local_128.m_backend.fpclass = local_1a8.fpclass;
      local_128.m_backend.prec_elem = local_1a8.prec_elem;
      local_128.m_backend.data._M_elems._24_8_ = auStack_140;
      local_128.m_backend.data._M_elems._32_8_ = local_138;
      RVar6 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      bVar12 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_128,RVar6);
      if (bVar12) {
        *(uint (*) [2])((u_00->data)._M_elems + 8) = local_138;
        *(uint (*) [2])((u_00->data)._M_elems + 4) = local_148;
        *(uint (*) [2])((u_00->data)._M_elems + 6) = auStack_140;
        *(ulong *)(u_00->data)._M_elems = local_158;
        *(uint (*) [2])((u_00->data)._M_elems + 2) = auStack_150;
        u_00->exp = iVar4;
        u_00->neg = bVar7;
        u_00->fpclass = fVar8;
        u_00->prec_elem = iVar9;
        iVar4 = *(int *)(this + 8);
        *(int *)(this + 8) = iVar4 + 1;
        *(int *)(*(long *)(this + 0x10) + (long)iVar4 * 4) = iVar3;
      }
    }
    uVar16 = (ulong)((int)uVar16 - 1);
    lVar15 = local_130;
    uVar14 = local_160;
  } while( true );
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)u_00,1e-100);
  bVar13 = true;
  uVar14 = local_160;
  goto LAB_0020f1c0;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::multAdd(S xx, const SVectorBase<T>& vec)
{
   if(isSetup())
   {
      R* v = VectorBase<R>::val.data();
      R x;
      bool adjust = false;
      int j;

      for(int i = vec.size() - 1; i >= 0; --i)
      {
         j = vec.index(i);

         if(v[j] != 0)
         {
            x = v[j] + xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
               v[j] = x;
            else
            {
               adjust = true;
               v[j] = SOPLEX_VECTOR_MARKER;
            }
         }
         else
         {
            x = xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
            {
               v[j] = x;
               addIdx(j);
            }
         }
      }

      if(adjust)
      {
         int* iptr = idx;
         int* iiptr = idx;
         int* endptr = idx + num;

         for(; iptr < endptr; ++iptr)
         {
            x = v[*iptr];

            if(isNotZero(x, this->tolerances()->epsilon()))
               *iiptr++ = *iptr;
            else
               v[*iptr] = 0;
         }

         num = int(iiptr - idx);
      }
   }
   else
      VectorBase<R>::multAdd(xx, vec);

   assert(isConsistent());

   return *this;
}